

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O0

ImageVolume * __thiscall
LayerConv::mat2img(ImageVolume *__return_storage_ptr__,LayerConv *this,MatrixXd *conv_mat,
                  LayerSize *output_size)

{
  long cols_00;
  long rows_00;
  long blockRows;
  Index IVar1;
  long lVar2;
  ConstBlockXpr local_c8;
  undefined1 local_90 [8];
  MatrixXd img_channel;
  undefined1 local_70 [4];
  int c;
  Image output_img;
  int local_48;
  int img_ind;
  Index opt_img_sz;
  Index cols;
  Index rows;
  LayerSize *output_size_local;
  MatrixXd *conv_mat_local;
  LayerConv *this_local;
  ImageVolume *output_volume;
  
  cols_00 = output_size->rows;
  rows_00 = output_size->cols;
  blockRows = cols_00 * rows_00;
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::vector(__return_storage_ptr__);
  for (local_48 = 0;
      IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        (&conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        ), local_48 < IVar1; local_48 = local_48 + (int)blockRows) {
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_70);
    for (img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols._4_4_ = 0;
        lVar2 = (long)img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols._4_4_,
        IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          (&conv_mat->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>),
        lVar2 < IVar1;
        img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols._4_4_ = img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols._4_4_ + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                (&local_c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)conv_mat,
                 (long)local_48,
                 (long)img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols._4_4_,blockRows,1);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_90,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_c8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_90,rows_00,
                 cols_00);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transposeInPlace
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_90);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_70,(value_type *)local_90);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_90);
    }
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_70);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume LayerConv::mat2img(const Eigen::MatrixXd& conv_mat, const LayerSize& output_size) {
	auto rows = output_size.rows;
	auto cols = output_size.cols;
	auto opt_img_sz = rows * cols; // output image size.

	ImageVolume output_volume;
	for (auto img_ind = 0; img_ind < conv_mat.rows(); img_ind += opt_img_sz) {
		Image output_img;
		for (auto c = 0; c < conv_mat.cols(); c++) {
			MatrixXd img_channel = conv_mat.block(img_ind, c, opt_img_sz, 1);
			img_channel.resize(cols, rows);
			img_channel.transposeInPlace();

			output_img.push_back(img_channel);
		}

		output_volume.push_back(output_img);
	}
	
	return output_volume;
}